

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O2

PolicyStatus __thiscall cmPolicies::PolicyMap::Get(PolicyMap *this,PolicyID id)

{
  int iVar1;
  PolicyStatus PVar2;
  
  iVar1 = id * 5;
  if (((this->Status).super__Base_bitset<5UL>._M_w[(ulong)(long)iVar1 >> 6] >> ((long)iVar1 & 0x3fU)
      & 1) != 0) {
    return OLD;
  }
  if (((this->Status).super__Base_bitset<5UL>._M_w[(ulong)(long)(iVar1 + 2) >> 6] >>
       ((long)(iVar1 + 2) & 0x3fU) & 1) == 0) {
    if (((this->Status).super__Base_bitset<5UL>._M_w[(ulong)(long)(iVar1 + 4) >> 6] >>
         ((long)(iVar1 + 4) & 0x3fU) & 1) == 0) {
      return (uint)(((this->Status).super__Base_bitset<5UL>._M_w[(ulong)(long)(iVar1 + 3) >> 6] >>
                     ((long)(iVar1 + 3) & 0x3fU) & 1) != 0) * 2 + WARN;
    }
    PVar2 = REQUIRED_ALWAYS;
  }
  else {
    PVar2 = NEW;
  }
  return PVar2;
}

Assistant:

cmPolicies::PolicyStatus
cmPolicies::PolicyMap::Get(cmPolicies::PolicyID id) const
{
  PolicyStatus status = cmPolicies::WARN;

  if (this->Status[(POLICY_STATUS_COUNT * id) + OLD])
    {
    status = cmPolicies::OLD;
    }
  else if (this->Status[(POLICY_STATUS_COUNT * id) + NEW])
    {
    status = cmPolicies::NEW;
    }
  else if (this->Status[(POLICY_STATUS_COUNT * id) + REQUIRED_ALWAYS])
    {
    status = cmPolicies::REQUIRED_ALWAYS;
    }
  else if (this->Status[(POLICY_STATUS_COUNT * id) + REQUIRED_IF_USED])
    {
    status = cmPolicies::REQUIRED_IF_USED;
    }
  return status;
}